

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe56At6(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = ((ulong)buf[3] |
          (ulong)buf[4] << 8 |
          (ulong)buf[5] << 0x10 | ((ulong)*(ushort *)(buf + 6) & 0x3fff) << 0x18) << 0x12;
  uVar3 = ((uint)(*buf >> 6) | (uint)buf[2] * 0x400 + (uint)buf[1] * 4) | uVar2;
  uVar1 = uVar3 | 0xff00000000000000;
  if (uVar2 >> 0x37 == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe56At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0xffffffffffffff);

    if (res >> 55) {
        res |= UINT64_C(0xff00000000000000);
    }

    return static_cast<std::int64_t>(res);
}